

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O1

MatrixXd * __thiscall
Tools::CalculateJacobian(MatrixXd *__return_storage_ptr__,Tools *this,VectorXd *x_state)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double *pdVar4;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar5;
  invalid_argument *this_00;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_90;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  Scalar local_50;
  Scalar local_48;
  double local_40;
  double local_38;
  Scalar local_30;
  Scalar local_28;
  double local_20;
  
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,0xc,3,4);
  lVar3 = (x_state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  if ((((lVar3 < 1) || (lVar3 == 1)) || (lVar3 < 3)) || (lVar3 == 3)) {
    __assert_fail("index >= 0 && index < size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0xad,
                  "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                 );
  }
  pdVar4 = (x_state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  fVar8 = (float)*pdVar4;
  if ((fVar8 != 0.0) || (NAN(fVar8))) {
    fVar9 = (float)pdVar4[1];
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      dVar1 = pdVar4[2];
      dVar2 = pdVar4[3];
      fVar6 = fVar9 * fVar9 + fVar8 * fVar8;
      if (fVar6 < 0.0) {
        fVar7 = sqrtf(fVar6);
      }
      else {
        fVar7 = SQRT(fVar6);
      }
      local_90.m_row = 0;
      local_90.m_col = 1;
      local_90.m_currentBlockRows = 1;
      *(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
       m_storage.m_data = (double)(fVar8 / fVar7);
      local_90.m_xpr = __return_storage_ptr__;
      local_20 = (double)(fVar9 / fVar7);
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (&local_90,&local_20);
      local_28 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_28);
      local_30 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_30);
      local_38 = (double)(-fVar9 / fVar6);
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_38);
      local_40 = (double)(fVar8 / fVar6);
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_40);
      local_48 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_48);
      local_50 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_50);
      fVar6 = ((float)dVar1 * fVar9 - (float)dVar2 * fVar8) / fVar6;
      local_58 = (double)(fVar9 * fVar6);
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_58);
      local_60 = (double)(fVar6 * fVar8);
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_60);
      local_68 = (double)(fVar8 / fVar7);
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_68);
      local_70 = (double)(fVar9 / fVar7);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                (pCVar5,&local_70);
      if (((local_90.m_currentBlockRows + local_90.m_row ==
            ((local_90.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
            m_storage.m_rows) ||
          (((local_90.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
           m_storage.m_cols == 0)) &&
         (local_90.m_col ==
          ((local_90.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
          m_storage.m_cols)) {
        return __return_storage_ptr__;
      }
      __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/CommaInitializer.h"
                    ,0x6f,
                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
                   );
    }
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Division by zero error calculation jacobian");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

MatrixXd Tools::CalculateJacobian(const VectorXd& x_state) {
    MatrixXd Hj(3,4);
    //recover state parameters
    float px = x_state(0);
    float py = x_state(1);
    float vx = x_state(2);
    float vy = x_state(3);

    //check division by zero
    if(px == 0 || py == 0) {
        throw std::invalid_argument("Division by zero error calculation jacobian");
    }

    //compute the Jacobian matrix
    float px2 = px * px;
    float py2 = py * py;
    float px2Ppy2 = px2 + py2;
    float px2Ppy2Sq = sqrt(px2Ppy2);
    float bigOne = (vx*py - vy*px)/(pow(px2Ppy2, 3/2));

    Hj << px/px2Ppy2Sq, py/px2Ppy2Sq, 0, 0,
            -py/px2Ppy2, px/px2Ppy2, 0, 0,
            py*bigOne, px*bigOne, px/px2Ppy2Sq, py/px2Ppy2Sq;

    return Hj;
}